

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XercesXPath::serialize(XercesXPath *this,XSerializeEngine *serEng)

{
  XMLSize_t dummyDataLen;
  XMLSize_t dummyBufferLen;
  XMLSize_t local_20;
  XMLSize_t local_18;
  
  if (serEng->fStoreLoad != 0) {
    XSerializeEngine::operator>>(serEng,&this->fEmptyNamespaceId);
    XSerializeEngine::readString(serEng,&this->fExpression,&local_18,&local_20,false);
    XTemplateSerializer::loadObject(&this->fLocationPaths,8,true,serEng);
    return;
  }
  XSerializeEngine::operator<<(serEng,this->fEmptyNamespaceId);
  XSerializeEngine::writeString(serEng,this->fExpression,0,false);
  XTemplateSerializer::storeObject(this->fLocationPaths,serEng);
  return;
}

Assistant:

void XercesXPath::serialize(XSerializeEngine& serEng)
{

    if (serEng.isStoring())
    {
        serEng<<fEmptyNamespaceId;
        serEng.writeString(fExpression);

        /***
         * Serialize RefVectorOf<XercesLocationPath>* fLocationPaths;
         ***/
        XTemplateSerializer::storeObject(fLocationPaths, serEng);
    }
    else
    {
        serEng>>fEmptyNamespaceId;
        serEng.readString(fExpression);

        /***
         * Deserialize RefVectorOf<XercesLocationPath>* fLocationPaths;
         ***/
        XTemplateSerializer::loadObject(&fLocationPaths, 8, true, serEng);
    }
}